

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O1

O3DGCErrorCode __thiscall
o3dgc::CompressedTriangleFans::SaveBinAC
          (CompressedTriangleFans *this,Vector<long> *data,BinaryStream *bstream)

{
  unsigned_long value;
  CompressedTriangleFans *pCVar1;
  uint uVar2;
  uchar *puVar3;
  long lVar4;
  ulong uVar5;
  unsigned_long position;
  Arithmetic_Codec ace;
  Adaptive_Bit_Model bModel;
  uchar local_89;
  unsigned_long local_88;
  CompressedTriangleFans *local_80;
  Arithmetic_Codec local_78;
  Adaptive_Bit_Model local_44;
  
  position = (bstream->m_stream).m_size;
  value = data->m_size;
  BinaryStream::WriteUInt32Bin(bstream,0);
  BinaryStream::WriteUInt32Bin(bstream,value);
  if (value != 0) {
    uVar2 = (int)value * 8 + 100;
    local_88 = CONCAT44(local_88._4_4_,uVar2);
    uVar5 = (ulong)uVar2;
    local_80 = this;
    if (this->m_sizeBufferAC < uVar5) {
      if (this->m_bufferAC != (uchar *)0x0) {
        operator_delete__(this->m_bufferAC);
      }
      this = local_80;
      local_80->m_sizeBufferAC = uVar5;
      puVar3 = (uchar *)operator_new__(uVar5);
      this->m_bufferAC = puVar3;
    }
    Arithmetic_Codec::Arithmetic_Codec(&local_78);
    Arithmetic_Codec::set_buffer(&local_78,(uint)local_88,this->m_bufferAC);
    Arithmetic_Codec::start_encoder(&local_78);
    local_88 = position;
    Adaptive_Bit_Model::Adaptive_Bit_Model(&local_44);
    lVar4 = 0;
    do {
      Arithmetic_Codec::encode(&local_78,*(uint *)(data->m_buffer + lVar4),&local_44);
      lVar4 = lVar4 + 1;
    } while (value + (value == 0) != lVar4);
    uVar2 = Arithmetic_Codec::stop_encoder(&local_78);
    pCVar1 = local_80;
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        local_89 = pCVar1->m_bufferAC[uVar5];
        Vector<unsigned_char>::PushBack(&bstream->m_stream,&local_89);
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    Arithmetic_Codec::~Arithmetic_Codec(&local_78);
    position = local_88;
  }
  BinaryStream::WriteUInt32Bin(bstream,position,(bstream->m_stream).m_size - position);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    CompressedTriangleFans::SaveBinAC(const Vector<long> & data,
                                                         BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();     
        const unsigned int NMAX = data.GetSize() * 8 + 100;
        const unsigned long size       = data.GetSize();
        bstream.WriteUInt32Bin(0);
        bstream.WriteUInt32Bin(size);
        if (size > 0)
        {
            if ( m_sizeBufferAC < NMAX )
            {
                delete [] m_bufferAC;
                m_sizeBufferAC = NMAX;
                m_bufferAC     = new unsigned char [m_sizeBufferAC];
            }
            Arithmetic_Codec ace;
            ace.set_buffer(NMAX, m_bufferAC);
            ace.start_encoder();
            Adaptive_Bit_Model bModel;
    #ifdef DEBUG_VERBOSE
            printf("-----------\nsize %i, start %i\n", size, start);
            fprintf(g_fileDebugTF, "-----------\nsize %i, start %i\n", size, start);
    #endif //DEBUG_VERBOSE
            for(unsigned long i = 0; i < size; ++i)
            {
                ace.encode(data[i], bModel);
    #ifdef DEBUG_VERBOSE
                printf("%i\t%i\n", i, data[i]);
                fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
    #endif //DEBUG_VERBOSE
            }
            unsigned long encodedBytes = ace.stop_encoder();
            for(unsigned long i = 0; i < encodedBytes; ++i)
            {
                bstream.WriteUChar8Bin(m_bufferAC[i]);
            }
        }
        bstream.WriteUInt32Bin(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }